

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.c
# Opt level: O1

int16_t OpalOperator_Output(OpalOperator *self,uint16_t keyscalenum,uint32_t phase_step,
                           int16_t vibrato,int16_t mod,int16_t fbshift)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  undefined2 uVar7;
  uint uVar8;
  uint uVar9;
  short sVar10;
  undefined6 in_register_00000032;
  uint uVar11;
  int iVar12;
  ushort uVar13;
  
  if (self->VibratoEnable == 0) {
    phase_step = 0;
  }
  uVar4 = ((uint)self->FreqMultTimes2 *
           (phase_step + (int)CONCAT62(in_register_00000032,keyscalenum)) >> 1) + self->Phase;
  uVar9 = (uint)(ushort)vibrato;
  self->Phase = uVar4;
  if (self->TremoloEnable == 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = (uint)self->Master->TremoloLevel;
  }
  if (3 < (uint)self->EnvelopeStage) goto LAB_0014957f;
  uVar3 = self->EnvelopeLevel;
  switch(self->EnvelopeStage) {
  case 0:
    uVar13 = self->Master->Clock;
    uVar2 = 0;
    sVar10 = (short)((int)(short)~uVar3 *
                     (uint)(self->AttackAdd >>
                           ((byte)self->AttackTab[uVar13 >> ((byte)self->AttackShift & 0x1f) & 7] &
                           0x1f)) >> 3);
    if (self->AttackRate == 0) {
      sVar10 = 0;
    }
    if ((self->AttackMask & uVar13) != 0) {
      sVar10 = 0;
    }
    self->EnvelopeLevel = sVar10 + uVar3;
    if ((short)(sVar10 + uVar3) < 1) {
      iVar12 = 1;
LAB_001495dd:
      self->EnvelopeLevel = uVar2;
      self->EnvelopeStage = iVar12;
    }
    break;
  case 1:
    uVar2 = self->Master->Clock;
    uVar13 = self->DecayAdd >>
             ((byte)self->DecayTab[uVar2 >> ((byte)self->DecayShift & 0x1f) & 7] & 0x1f);
    if (self->DecayRate == 0) {
      uVar13 = 0;
    }
    if ((self->DecayMask & uVar2) != 0) {
      uVar13 = 0;
    }
    self->EnvelopeLevel = uVar3 + uVar13;
    uVar2 = self->SustainLevel;
    if ((int)(uint)uVar2 <= (int)(short)(uVar3 + uVar13)) {
      iVar12 = 2;
      goto LAB_001495dd;
    }
    break;
  case 2:
    if (self->SustainMode == 0) goto switchD_001494ba_caseD_3;
    break;
  case 3:
switchD_001494ba_caseD_3:
    uVar2 = self->Master->Clock;
    uVar13 = self->ReleaseAdd >>
             ((byte)self->ReleaseTab[uVar2 >> ((byte)self->ReleaseShift & 0x1f) & 7] & 0x1f);
    if (self->ReleaseRate == 0) {
      uVar13 = 0;
    }
    if ((self->ReleaseMask & uVar2) != 0) {
      uVar13 = 0;
    }
    self->EnvelopeLevel = uVar3 + uVar13;
    if (0x1fe < (short)(uVar3 + uVar13)) {
      self->EnvelopeLevel = 0x1ff;
      self->EnvelopeStage = -1;
LAB_0014957f:
      self->Out[0] = 0;
      self->Out[1] = 0;
      return 0;
    }
  }
  if (mod != 0) {
    uVar9 = uVar9 + ((int)self->Out[1] + (int)self->Out[0] >> ((byte)mod & 0x1f));
  }
  uVar9 = uVar9 + (uVar4 >> 10);
  uVar4 = uVar9 & 0xffff;
  if (6 < self->Waveform) {
    uVar2 = (ushort)((uVar9 & 0x200) >> 9);
    uVar8 = (uVar9 & 0x1ff) << 3;
    uVar4 = uVar8 ^ 0xff8;
    if ((uVar9 & 0x200) == 0) {
      uVar4 = uVar8;
    }
    goto LAB_00149714;
  }
  uVar8 = uVar9 & 0xff;
  bVar6 = (byte)uVar9;
  switch(self->Waveform) {
  case 0:
    if ((uVar4 >> 8 & 1) != 0) {
      bVar6 = ~bVar6;
    }
    uVar2 = (ushort)(uVar4 >> 9) & 1;
    uVar4 = (uint)LogSinTable[bVar6];
    goto LAB_00149714;
  case 1:
    if ((uVar4 >> 8 & 1) != 0) {
      uVar8 = ~uVar8;
    }
    iVar12 = 9;
    uVar8 = uVar8 & 0xff;
    goto LAB_001496d0;
  case 2:
    if ((uVar4 >> 8 & 1) != 0) {
      uVar8 = ~uVar8;
    }
    uVar5 = (ulong)uVar8 & 0xff;
    break;
  case 3:
    iVar12 = 8;
LAB_001496d0:
    uVar5 = (ulong)uVar8;
    if ((uVar4 >> iVar12 & 1) != 0) {
      uVar5 = 0;
    }
    break;
  case 4:
    if ((uVar4 >> 9 & 1) == 0) {
      uVar9 = ((uint)(int)(char)uVar4 >> 7 ^ uVar8 * 2) & 0xfe;
      uVar2 = (ushort)(uVar4 >> 8) & 1;
    }
    else {
      uVar9 = 0;
      uVar2 = 0;
    }
    uVar4 = (uint)LogSinTable[uVar9];
    goto LAB_00149714;
  case 5:
    if ((uVar4 >> 9 & 1) == 0) {
      bVar1 = ~(bVar6 * '\x02');
      if (-1 < (char)uVar4) {
        bVar1 = bVar6 * '\x02';
      }
      uVar5 = (ulong)bVar1;
    }
    else {
      uVar5 = 0;
    }
    break;
  case 6:
    uVar2 = (ushort)(uVar4 >> 9) & 1;
    uVar4 = 0;
    goto LAB_00149714;
  }
  uVar2 = 0;
  uVar4 = (uint)LogSinTable[uVar5];
LAB_00149714:
  uVar4 = uVar4 + ((ushort)(self->OutputLevel + uVar3 + self->KeyScaleLevel) + uVar11) * 8;
  uVar7 = (undefined2)uVar4;
  if (0x1ffe < (uVar4 & 0xffff)) {
    uVar7 = 0x1fff;
  }
  uVar3 = -uVar2 ^ (short)((int)(short)(ExpTable[(byte)uVar7] + 0x400) >>
                          ((byte)((ushort)uVar7 >> 8) & 0x1f)) * 2;
  self->Out[1] = self->Out[0];
  self->Out[0] = uVar3;
  return uVar3;
}

Assistant:

static int16_t OpalOperator_Output(OpalOperator *self, uint16_t keyscalenum, uint32_t phase_step, int16_t vibrato, int16_t mod, int16_t fbshift)
{
    int16_t v;
    uint16_t mix, phase, offset, logsin, add, level, negate;

    (void)keyscalenum;

    /* Advance wave phase */
    if(self->VibratoEnable)
        phase_step += vibrato;

    self->Phase += (phase_step * self->FreqMultTimes2) / 2;

    level = (self->EnvelopeLevel + self->OutputLevel + self->KeyScaleLevel + (self->TremoloEnable ? self->Master->TremoloLevel : 0)) << 3;

    switch(self->EnvelopeStage)
    {

    /* Attack stage */
    case OpalEnvAtt:
    {
        add = ((self->AttackAdd >> self->AttackTab[self->Master->Clock >> self->AttackShift & 7]) * ~self->EnvelopeLevel) >> 3;

        if(self->AttackRate == 0)
            add = 0;

        if(self->AttackMask && (self->Master->Clock & self->AttackMask))
            add = 0;

        self->EnvelopeLevel += add;

        if(self->EnvelopeLevel <= 0)
        {
            self->EnvelopeLevel = 0;
            self->EnvelopeStage = OpalEnvDec;
        }

        break;
    }

    /* Decay stage */
    case OpalEnvDec:
    {
        add = self->DecayAdd >> self->DecayTab[self->Master->Clock >> self->DecayShift & 7];

        if(self->DecayRate == 0)
            add = 0;

        if(self->DecayMask && (self->Master->Clock & self->DecayMask))
            add = 0;

        self->EnvelopeLevel += add;

        if(self->EnvelopeLevel >= self->SustainLevel)
        {
            self->EnvelopeLevel = self->SustainLevel;
            self->EnvelopeStage = OpalEnvSus;
        }

        break;
    }

    /* Sustain stage */
    case OpalEnvSus:
    {
        if(self->SustainMode)
            break;

        /* Note: fall-through! */

    } /* fallthrough */

    /* Release stage */
    case OpalEnvRel:
    {
        add = self->ReleaseAdd >> self->ReleaseTab[self->Master->Clock >> self->ReleaseShift & 7];

        if(self->ReleaseRate == 0)
            add = 0;

        if(self->ReleaseMask && (self->Master->Clock & self->ReleaseMask))
            add = 0;

        self->EnvelopeLevel += add;

        if(self->EnvelopeLevel >= 0x1FF)
        {
            self->EnvelopeLevel = 0x1FF;
            self->EnvelopeStage = OpalEnvOff;
            self->Out[0] = self->Out[1] = 0;
            return 0;
        }

        break;
    }

    /* Envelope, and therefore the operator, is not running */
    default:
        self->Out[0] = self->Out[1] = 0;
        return 0;
    }

    /* Feedback?  In that case we modulate by a blend of the last two samples */
    if(fbshift)
        mod += (self->Out[0] + self->Out[1]) >> fbshift;

    phase = (self->Phase >> 10) + mod;
    offset = phase & 0xFF;
    negate = OPAL_FALSE;

    switch(self->Waveform)
    {

    /*------------------------------------
     * Standard sine wave
     *------------------------------------*/
    case 0:
        if(phase & 0x100)
            offset ^= 0xFF;

        logsin = LogSinTable[offset];
        negate = (phase & 0x200) != 0;
        break;

    /*------------------------------------
     * Half sine wave
     *------------------------------------*/
    case 1:
        if(phase & 0x200)
            offset = 0;
        else if(phase & 0x100)
            offset ^= 0xFF;

        logsin = LogSinTable[offset];
        break;

    /*------------------------------------
     * Positive sine wave
     *------------------------------------*/
    case 2:
        if(phase & 0x100)
            offset ^= 0xFF;

        logsin =  LogSinTable[offset];
        break;

    /*------------------------------------
     * Quarter positive sine wave
     *------------------------------------*/
    case 3:
        if(phase & 0x100)
            offset = 0;

        logsin = LogSinTable[offset];
        break;

    /*------------------------------------
     * Double-speed sine wave
     *------------------------------------*/
    case 4:
        if(phase & 0x200)
            offset = 0;

        else
        {

            if(phase & 0x80)
                offset ^= 0xFF;

            offset = (offset + offset) & 0xFF;
            negate = (phase & 0x100) != 0;
        }

        logsin = LogSinTable[offset];
        break;

    /*------------------------------------
     * Double-speed positive sine wave
     *------------------------------------*/
    case 5:
        if(phase & 0x200)
            offset = 0;

        else
        {

            offset = (offset + offset) & 0xFF;

            if(phase & 0x80)
                offset ^= 0xFF;
        }

        logsin = LogSinTable[offset];
        break;

    /*------------------------------------
     * Square wave
     *------------------------------------*/
    case 6:
        logsin = 0;
        negate = (phase & 0x200) != 0;
        break;

    /*------------------------------------
     * Exponentiation wave
     *------------------------------------*/
    default:
        logsin = phase & 0x1FF;

        if(phase & 0x200)
        {
            logsin ^= 0x1FF;
            negate = OPAL_TRUE;
        }

        logsin <<= 3;
        break;
    }

    mix = logsin + level;

    if(mix > 0x1FFF)
        mix = 0x1FFF;

    /* From the OPLx decapsulated docs:
     * "When such a table is used for calculation of the exponential, the table is read at the
     * position given by the 8 LSB's of the input. The value + 1024 (the hidden bit) is then the
     * significand of the floating point output and the yet unused MSB's of the input are the
     * exponent of the floating point output." */
    v = ExpTable[mix & 0xFF] + 1024;
    v >>= mix >> 8;
    v += v;

    if(negate)
        v = ~v;

    /* Keep last two results for feedback calculation */
    self->Out[1] = self->Out[0];
    self->Out[0] = v;

    return v;
}